

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_reserve(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  MSize sz;
  SBufExt *sb;
  void *pvVar3;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)((uint)(sb->L).ptr64 & 7) | (ulong)L;
  sz = lj_lib_checkintrange(L,2,0,0x7fffff00);
  if ((uint)(*(int *)&sb->e - *(int *)&sb->w) < sz) {
    lj_buf_more2((SBuf *)sb,sz);
  }
  if (*(long *)((L->glref).ptr64 + 0x180) == 0) {
    pTVar1 = L->top;
    uVar2 = (L->stack).ptr64;
    luaopen_ffi(L);
    L->top = (TValue *)((long)pTVar1 + ((L->stack).ptr64 - uVar2));
  }
  pvVar3 = lj_mem_newgco(L,0x18);
  *(undefined1 *)((long)pvVar3 + 9) = 10;
  *(undefined2 *)((long)pvVar3 + 10) = 0x14;
  *(char **)((long)pvVar3 + 0x10) = sb->w;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = (ulong)pvVar3 | 0xfffa800000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = (double)(*(int *)&sb->e - *(int *)&sb->w);
  return 2;
}

Assistant:

LJLIB_CF(buffer_method_reserve)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  MSize sz = (MSize)lj_lib_checkintrange(L, 2, 0, LJ_MAX_BUF);
  GCcdata *cd;
  lj_buf_more((SBuf *)sbx, sz);
  ctype_loadffi(L);
  cd = lj_cdata_new_(L, CTID_P_UINT8, CTSIZE_PTR);
  *(void **)cdataptr(cd) = sbx->w;
  setcdataV(L, L->top++, cd);
  setintV(L->top++, sbufleft(sbx));
  return 2;
}